

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::filterPoints(Earcut<unsigned_int> *this,Node *start,Node *end)

{
  bool bVar1;
  bool bVar2;
  Node *in_RDX;
  Node *in_RSI;
  Earcut<unsigned_int> *in_RDI;
  double dVar3;
  bool again;
  Node *p;
  Node *local_20;
  Node *local_18;
  
  local_20 = in_RSI;
  local_18 = in_RDX;
  if (in_RDX == (Node *)0x0) {
    local_18 = in_RSI;
  }
  do {
    bVar1 = false;
    if ((local_20->steiner & 1U) == 0) {
      bVar2 = equals(in_RDI,local_20,local_20->next);
      if (!bVar2) {
        dVar3 = area(in_RDI,local_20->prev,local_20,local_20->next);
        if ((dVar3 != 0.0) || (NAN(dVar3))) goto LAB_0019ae90;
      }
      removeNode(in_RDI,local_20);
      local_20 = local_20->prev;
      if (local_20 == local_20->next) {
        return local_20;
      }
      bVar1 = true;
      local_18 = local_20;
    }
    else {
LAB_0019ae90:
      local_20 = local_20->next;
    }
    if (!bVar1 && local_20 == local_18) {
      return local_18;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::filterPoints(Node* start, Node* end) {
    if (!end) end = start;

    Node* p = start;
    bool again;
    do {
        again = false;

        if (!p->steiner && (equals(p, p->next) || area(p->prev, p, p->next) == 0)) {
            removeNode(p);
            p = end = p->prev;

            if (p == p->next) break;
            again = true;

        } else {
            p = p->next;
        }
    } while (again || p != end);

    return end;
}